

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall
QTreeView::drawBranches(QTreeView *this,QPainter *painter,QRect *rect,QModelIndex *index)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  QAbstractItemModel *pQVar8;
  ulong uVar9;
  QFlagsStorage<QStyle::StateFlag> QVar10;
  bool bVar11;
  char cVar12;
  bool bVar13;
  LayoutDirection LVar14;
  ScrollMode SVar15;
  int iVar16;
  SelectionBehavior SVar17;
  uint uVar18;
  int iVar19;
  undefined8 uVar20;
  QStyle *pQVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  uint *puVar27;
  int iVar28;
  long in_FS_OFFSET;
  int local_1c8;
  int local_1c0;
  int local_198;
  int local_194;
  undefined1 *local_190;
  long *local_188;
  undefined8 local_180;
  undefined1 *local_178;
  long *plStack_170;
  undefined1 *local_168;
  undefined1 *puStack_160;
  long *local_158;
  undefined1 *local_148;
  undefined1 *puStack_140;
  long *local_138;
  undefined1 *local_128;
  undefined1 *puStack_120;
  long *local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  LVar14 = QWidget::layoutDirection((QWidget *)this);
  bVar1 = *(byte *)(lVar6 + 0x5c1);
  iVar22 = (rect->x2).m_i + 1;
  iVar23 = *(int *)(lVar6 + 0x598);
  iVar3 = *(int *)(lVar6 + 0x5d0);
  lVar7 = *(long *)(lVar6 + 0x5a8);
  uVar2 = *(ushort *)(lVar7 + 0x20 + (long)iVar3 * 0x28);
  uVar24 = (uint)uVar2;
  iVar28 = (rect->x1).m_i;
  iVar25 = iVar22;
  if (LVar14 == RightToLeft) {
    iVar25 = iVar28;
  }
  iVar4 = (rect->y1).m_i;
  iVar5 = (rect->y2).m_i;
  local_118 = (long *)&DAT_aaaaaaaaaaaaaaaa;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar8 = (index->m).ptr;
  if (pQVar8 == (QAbstractItemModel *)0x0) {
    local_128 = (undefined1 *)0xffffffffffffffff;
    puStack_120 = (undefined1 *)0x0;
    local_118 = (long *)0x0;
  }
  else {
    (**(code **)(*(long *)pQVar8 + 0x68))(&local_128);
  }
  local_138 = local_118;
  local_148 = local_128;
  puStack_140 = puStack_120;
  local_158 = (long *)&DAT_aaaaaaaaaaaaaaaa;
  local_168 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_160 = &DAT_aaaaaaaaaaaaaaaa;
  if (local_118 == (long *)0x0) {
    local_168 = (undefined1 *)0xffffffffffffffff;
    puStack_160 = (undefined1 *)0x0;
    local_158 = (long *)0x0;
  }
  else {
    (**(code **)(*local_118 + 0x68))(&local_168,local_118,&local_148);
  }
  memset(&local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x2f8))(this,&local_108);
  uVar26 = ~((this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
            data)->widget_attributes & 1;
  bVar11 = QWidget::hasFocus((QWidget *)this);
  uVar18 = uVar26 + 0x10000;
  if (!bVar11) {
    uVar18 = uVar26;
  }
  uVar20 = QPainter::brushOrigin();
  SVar15 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
  if (SVar15 == ScrollPerPixel) {
    iVar16 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                    super_QFrame.super_QWidget + 0x2b8))();
    local_180 = (undefined1 *)0x0;
    local_178 = (undefined1 *)(double)iVar16;
    QPainter::setBrushOrigin((QPointF *)painter);
  }
  if (*(char *)(lVar6 + 0x42a) == '\x01') {
    local_108.features.super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
    super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i =
         (QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>)
         (((uint)local_108.features.
                 super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                 super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 0xfffffffd) +
         (*(uint *)(lVar6 + 0x5d0) & 1) * 2);
  }
  uVar26 = bVar1 ^ 1;
  SVar17 = QAbstractItemView::selectionBehavior((QAbstractItemView *)this);
  if (SVar17 != SelectRows) {
    bVar11 = false;
    goto LAB_005ae9b9;
  }
  if (local_108.showDecorationSelected == true) {
    pQVar8 = (index->m).ptr;
    if (pQVar8 == (QAbstractItemModel *)0x0) {
      local_180 = (undefined1 *)0xffffffffffffffff;
      local_178 = (undefined1 *)0x0;
      plStack_170 = (long *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar8 + 0x68))(&local_180);
    }
    QPersistentModelIndex::parent();
    if ((int)local_180 != local_198) {
      bVar11 = false;
      goto LAB_005ae9b9;
    }
    if (((local_180._4_4_ == local_194) && (local_178 == local_190)) && (plStack_170 == local_188))
    {
      iVar16 = index->r;
      iVar19 = QPersistentModelIndex::row();
      bVar11 = iVar16 == iVar19;
      goto LAB_005ae9b9;
    }
  }
  bVar11 = false;
LAB_005ae9b9:
  puVar27 = (uint *)(lVar7 + (long)iVar3 * 0x28 + 0x1c);
  cVar12 = QItemSelectionModel::isSelected(*(QModelIndex **)(lVar6 + 0x328));
  QVar10.i = uVar18 | 0x8000;
  if (cVar12 == '\0') {
    QVar10.i = uVar18;
  }
  if (uVar2 < uVar26) {
    iVar28 = iVar23 + iVar25 + -1;
  }
  else {
    iVar25 = iVar22 - iVar23;
    if (LVar14 == RightToLeft) {
      iVar25 = iVar28;
    }
    iVar28 = iVar23 + -1 + iVar25;
    uVar18 = *puVar27;
    uVar18 = (uVar18 & 9) << 0x12 | (uVar18 & 4) << 0x11;
    if ((bVar11) || (iVar3 == *(int *)(lVar6 + 0x620))) {
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)(uVar18 | QVar10.i | 0x102000);
    }
    else {
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)(QVar10.i + uVar18 + 0x100000 & 0x3fdfff);
    }
    local_108.super_QStyleOption.rect.x1.m_i = iVar25;
    local_108.super_QStyleOption.rect.y1.m_i = iVar4;
    local_108.super_QStyleOption.rect.x2.m_i = iVar28;
    local_108.super_QStyleOption.rect.y2.m_i = iVar5;
    pQVar21 = QWidget::style((QWidget *)this);
    (**(code **)(*(long *)pQVar21 + 0xb0))(pQVar21,0x17,&local_108,painter);
  }
  if (uVar26 <= uVar2 && uVar2 != uVar26) {
    iVar22 = -iVar23;
    if (LVar14 == RightToLeft) {
      iVar22 = iVar23;
    }
    do {
      uVar24 = uVar24 - 1;
      iVar25 = iVar25 + iVar22;
      iVar28 = iVar28 + iVar22;
      local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)QVar10.i;
      local_108.super_QStyleOption.rect.x1.m_i = iVar25;
      local_108.super_QStyleOption.rect.x2.m_i = iVar28;
      if ((*(long *)(lVar6 + 0x5e8) == 0) || (*(long *)(*(long *)(lVar6 + 0x5e8) + 8) == 0)) {
        local_108.super_QStyleOption.rect.y1.m_i = iVar4;
        local_108.super_QStyleOption.rect.y2.m_i = iVar5;
        iVar23 = (**(code **)(**(long **)(lVar6 + 0x2f8) + 0x78))
                           (*(long **)(lVar6 + 0x2f8),&local_168);
        bVar13 = (int)local_148 < iVar23 + -1;
      }
      else {
        iVar23 = (*puVar27 >> 4) + iVar3 + 1;
        bVar13 = false;
        do {
          local_108.super_QStyleOption.rect.y1.m_i = iVar4;
          local_108.super_QStyleOption.rect.y2.m_i = iVar5;
          if (*(long *)(lVar6 + 0x5b0) <= (long)iVar23) goto LAB_005aebec;
          uVar9 = *(ulong *)(*(long *)(lVar6 + 0x5a8) + 0x1c + (long)iVar23 * 0x28);
          uVar18 = (uint)(uVar9 >> 0x20) & 0xffff;
          if (uVar18 < uVar24) goto LAB_005aebec;
          iVar16 = ((uint)(uVar9 >> 4) & 0xfffffff) + 1;
          if (uVar18 == uVar24) {
            iVar16 = 0;
          }
          iVar23 = iVar16 + iVar23;
        } while (uVar18 != uVar24);
        bVar13 = true;
      }
LAB_005aebec:
      if (bVar13) {
        local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorageHelper<QStyle::StateFlag,_4>)
             ((uint)local_108.super_QStyleOption.state.
                    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                    super_QFlagsStorage<QStyle::StateFlag>.i | 0x200000);
      }
      if ((bVar11) || (iVar3 == *(int *)(lVar6 + 0x620))) {
        local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorageHelper<QStyle::StateFlag,_4>)
             ((uint)local_108.super_QStyleOption.state.
                    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                    super_QFlagsStorage<QStyle::StateFlag>.i | 0x2000);
      }
      else {
        local_108.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorageHelper<QStyle::StateFlag,_4>)
             ((uint)local_108.super_QStyleOption.state.
                    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                    super_QFlagsStorage<QStyle::StateFlag>.i & 0xffffdfff);
      }
      pQVar21 = QWidget::style((QWidget *)this);
      (**(code **)(*(long *)pQVar21 + 0xb0))(pQVar21,0x17,&local_108,painter);
      local_138 = local_158;
      local_148 = local_168;
      puStack_140 = puStack_160;
      if (local_158 == (long *)0x0) {
        local_180 = (undefined1 *)0xffffffffffffffff;
        local_178 = (undefined1 *)0x0;
        plStack_170 = (long *)0x0;
      }
      else {
        (**(code **)(*local_158 + 0x68))(&local_180,local_158,&local_148);
      }
      local_158 = plStack_170;
      local_168 = local_180;
      puStack_160 = local_178;
    } while ((int)uVar26 < (int)uVar24);
  }
  local_1c0 = (int)uVar20;
  local_180 = (undefined1 *)(double)local_1c0;
  local_1c8 = (int)((ulong)uVar20 >> 0x20);
  local_178 = (undefined1 *)(double)local_1c8;
  QPainter::setBrushOrigin((QPointF *)painter);
  QBrush::~QBrush(&local_108.backgroundBrush);
  if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_108.icon);
  QLocale::~QLocale(&local_108.locale);
  QFont::~QFont(&local_108.font);
  QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::drawBranches(QPainter *painter, const QRect &rect,
                             const QModelIndex &index) const
{
    Q_D(const QTreeView);
    const bool reverse = isRightToLeft();
    const int indent = d->indent;
    const int outer = d->rootDecoration ? 0 : 1;
    const int item = d->current;
    const QTreeViewItem &viewItem = d->viewItems.at(item);
    int level = viewItem.level;
    QRect primitive(reverse ? rect.left() : rect.right() + 1, rect.top(), indent, rect.height());

    QModelIndex parent = index.parent();
    QModelIndex current = parent;
    QModelIndex ancestor = current.parent();

    QStyleOptionViewItem opt;
    initViewItemOption(&opt);
    QStyle::State extraFlags = QStyle::State_None;
    if (isEnabled())
        extraFlags |= QStyle::State_Enabled;
    if (hasFocus())
        extraFlags |= QStyle::State_Active;
    QPoint oldBO = painter->brushOrigin();
    if (verticalScrollMode() == QAbstractItemView::ScrollPerPixel)
        painter->setBrushOrigin(QPoint(0, verticalOffset()));

    if (d->alternatingColors) {
        opt.features.setFlag(QStyleOptionViewItem::Alternate, d->current & 1);
    }

    // When hovering over a row, pass State_Hover for painting the branch
    // indicators if it has the decoration (aka branch) selected.
    bool hoverRow = selectionBehavior() == QAbstractItemView::SelectRows
                    && opt.showDecorationSelected
                    && index.parent() == d->hover.parent()
                    && index.row() == d->hover.row();

    if (d->selectionModel->isSelected(index))
        extraFlags |= QStyle::State_Selected;

    if (level >= outer) {
        // start with the innermost branch
        primitive.moveLeft(reverse ? primitive.left() : primitive.left() - indent);
        opt.rect = primitive;

        const bool expanded = viewItem.expanded;
        const bool children = viewItem.hasChildren;
        bool moreSiblings = viewItem.hasMoreSiblings;

        opt.state = QStyle::State_Item | extraFlags
                    | (moreSiblings ? QStyle::State_Sibling : QStyle::State_None)
                    | (children ? QStyle::State_Children : QStyle::State_None)
                    | (expanded ? QStyle::State_Open : QStyle::State_None);
        opt.state.setFlag(QStyle::State_MouseOver, hoverRow || item == d->hoverBranch);

        style()->drawPrimitive(QStyle::PE_IndicatorBranch, &opt, painter, this);
    }
    // then go out level by level
    for (--level; level >= outer; --level) { // we have already drawn the innermost branch
        primitive.moveLeft(reverse ? primitive.left() + indent : primitive.left() - indent);
        opt.rect = primitive;
        opt.state = extraFlags;
        bool moreSiblings = false;
        if (d->hiddenIndexes.isEmpty()) {
            moreSiblings = (d->model->rowCount(ancestor) - 1 > current.row());
        } else {
            int successor = item + viewItem.total + 1;
            while (successor < d->viewItems.size()
                   && d->viewItems.at(successor).level >= uint(level)) {
                const QTreeViewItem &successorItem = d->viewItems.at(successor);
                if (successorItem.level == uint(level)) {
                    moreSiblings = true;
                    break;
                }
                successor += successorItem.total + 1;
            }
        }
        if (moreSiblings)
            opt.state |= QStyle::State_Sibling;
        opt.state.setFlag(QStyle::State_MouseOver, hoverRow || item == d->hoverBranch);

        style()->drawPrimitive(QStyle::PE_IndicatorBranch, &opt, painter, this);
        current = ancestor;
        ancestor = current.parent();
    }
    painter->setBrushOrigin(oldBO);
}